

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

bool __thiscall
GdlNumericExpression::CheckTypeAndUnits(GdlNumericExpression *this,ExpressionType *pexptRet)

{
  ExpressionType *pexptRet_local;
  GdlNumericExpression *this_local;
  
  if ((this->m_nValue == 0) && (this->m_munits == -1)) {
    *pexptRet = kexptZero;
  }
  else if ((this->m_nValue == 1) && (this->m_munits == -1)) {
    *pexptRet = kexptOne;
  }
  else if (this->m_munits == -1) {
    *pexptRet = kexptNumber;
  }
  else {
    *pexptRet = kexptMeas;
  }
  return true;
}

Assistant:

bool GdlNumericExpression::CheckTypeAndUnits(ExpressionType * pexptRet)
{
	if (m_nValue == 0 && m_munits == kmunitNone)
		//	so that 0 can be treated as equivalent to 0m
		*pexptRet = kexptZero;
	else if (m_nValue == 1 && m_munits == kmunitNone)
		*pexptRet = kexptOne;
	else if (m_munits == kmunitNone)
		*pexptRet = kexptNumber;
	else
		*pexptRet = kexptMeas;

	return true;
}